

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_tri_norm_deviation(REF_GRID ref_grid,REF_INT *nodes,REF_DBL *dot_product)

{
  REF_INT faceid;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_raise;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS status;
  REF_INT id;
  REF_DBL area_sign;
  REF_DBL n [3];
  REF_DBL local_98;
  REF_DBL s [3];
  REF_DBL local_78;
  REF_DBL r [3];
  double local_58;
  REF_DBL tri_normal [3];
  REF_DBL local_38;
  REF_DBL uv [2];
  REF_DBL *dot_product_local;
  REF_INT *nodes_local;
  REF_GRID ref_grid_local;
  
  *dot_product = -2.0;
  uv[1] = (REF_DBL)dot_product;
  if (ref_grid->geom->meshlink == (void *)0x0) {
    faceid = nodes[ref_grid->cell[3]->node_per];
    ref_grid_local._4_4_ = ref_node_tri_normal(ref_grid->node,nodes,&local_58);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ = ref_math_normalize(&local_58);
      if (ref_grid_local._4_4_ == 4) {
        ref_grid_local._4_4_ = 0;
      }
      else if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = ref_geom_tri_centroid(ref_grid,nodes,&local_38);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ =
               ref_geom_face_rsn(ref_grid->geom,faceid,&local_38,&local_78,&local_98,&area_sign);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = ref_geom_uv_area_sign(ref_grid,faceid,(REF_DBL *)&status);
            if (ref_grid_local._4_4_ == 0) {
              *(double *)uv[1] =
                   _status * (n[1] * tri_normal[1] + area_sign * local_58 + n[0] * tri_normal[0]);
              ref_grid_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x6e7,"ref_geom_tri_norm_deviation",(ulong)ref_grid_local._4_4_,"a sign");
            }
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x6e5,"ref_geom_tri_norm_deviation",(ulong)ref_grid_local._4_4_,"tri cent");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x6e3,"ref_geom_tri_norm_deviation",(ulong)ref_grid_local._4_4_,"normalize");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x6df,
             "ref_geom_tri_norm_deviation",(ulong)ref_grid_local._4_4_,"tri normal");
    }
  }
  else {
    ref_grid_local._4_4_ = ref_meshlink_tri_norm_deviation(ref_grid,nodes,dot_product);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x6d9,
             "ref_geom_tri_norm_deviation",(ulong)ref_grid_local._4_4_,"meshlink");
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tri_norm_deviation(REF_GRID ref_grid,
                                               REF_INT *nodes,
                                               REF_DBL *dot_product) {
  REF_DBL uv[2];
  REF_DBL tri_normal[3];
  REF_DBL r[3], s[3], n[3], area_sign;
  REF_INT id;
  REF_STATUS status;
  *dot_product = -2.0;

  if (ref_geom_meshlinked(ref_grid_geom(ref_grid))) {
    RSS(ref_meshlink_tri_norm_deviation(ref_grid, nodes, dot_product),
        "meshlink");
    return REF_SUCCESS;
  }

  id = nodes[ref_cell_node_per(ref_grid_tri(ref_grid))];
  RSS(ref_node_tri_normal(ref_grid_node(ref_grid), nodes, tri_normal),
      "tri normal");
  /* collapse attempts could create zero area, reject the step with -2.0 */
  status = ref_math_normalize(tri_normal);
  if (REF_DIV_ZERO == status) return REF_SUCCESS;
  RSS(status, "normalize");

  RSS(ref_geom_tri_centroid(ref_grid, nodes, uv), "tri cent");
  RAISE(ref_geom_face_rsn(ref_grid_geom(ref_grid), id, uv, r, s, n));
  RSS(ref_geom_uv_area_sign(ref_grid, id, &area_sign), "a sign");

  *dot_product = area_sign * ref_math_dot(n, tri_normal);

  return REF_SUCCESS;
}